

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

tensor * __thiscall
dlib::tensor::operator+=
          (tensor *this,
          matrix_exp<dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>_>_>
          *item)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  fatal_error *this_00;
  string local_1b0;
  ostringstream dlib_o_out;
  uint auStack_178 [88];
  
  if ((this->m_n == *(long *)(*(long *)item + 8)) &&
     (this->m_nc * this->m_nr * this->m_k - *(long *)(*(long *)(item + 8) + 0x10) == 0)) {
    iVar1 = (*this->_vptr_tensor[3])(this);
    _dlib_o_out = (float *)CONCAT44(extraout_var,iVar1);
    assignable_ptr_matrix<float>::operator+=((assignable_ptr_matrix<float> *)&dlib_o_out,item);
    return this;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x85);
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor.h"
                          );
  std::operator<<(poVar2,".\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
  poVar2 = std::operator<<(poVar2,
                           "tensor &dlib::tensor::operator+=(const matrix_exp<EXP> &) [EXP = dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>>, dlib::matrix<float>>]"
                          );
  std::operator<<(poVar2,".\n\n");
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
  poVar2 = std::operator<<(poVar2,"num_samples() == item.nr() && nr()*nc()*k() == item.nc()");
  std::operator<<(poVar2,".\n");
  *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) =
       *(uint *)((long)auStack_178 + *(long *)(_dlib_o_out + -6)) | 1;
  poVar2 = std::operator<<((ostream *)&dlib_o_out,"");
  std::operator<<(poVar2,"\n");
  this_00 = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  fatal_error::fatal_error(this_00,EBROKEN_ASSERT,&local_1b0);
  __cxa_throw(this_00,&fatal_error::typeinfo,error::~error);
}

Assistant:

long long nc() const { return m_nc; }